

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogPrefer xmlCatalogSetDefaultPrefer(xmlCatalogPrefer prefer)

{
  xmlCatalogPrefer xVar1;
  xmlCatalogPrefer xVar2;
  xmlCatalogPrefer ret;
  xmlCatalogPrefer prefer_local;
  
  xVar1 = xmlCatalogDefaultPrefer;
  xVar2 = xmlCatalogDefaultPrefer;
  if ((prefer != XML_CATA_PREFER_NONE) && (xVar2 = prefer, xmlDebugCatalogs != 0)) {
    if (prefer == XML_CATA_PREFER_PUBLIC) {
      xmlCatalogPrintDebug("Setting catalog preference to PUBLIC\n");
      xVar2 = prefer;
    }
    else {
      xVar2 = xmlCatalogDefaultPrefer;
      if (prefer == XML_CATA_PREFER_SYSTEM) {
        xmlCatalogPrintDebug("Setting catalog preference to SYSTEM\n");
        xVar2 = prefer;
      }
    }
  }
  xmlCatalogDefaultPrefer = xVar2;
  return xVar1;
}

Assistant:

xmlCatalogPrefer
xmlCatalogSetDefaultPrefer(xmlCatalogPrefer prefer) {
    xmlCatalogPrefer ret = xmlCatalogDefaultPrefer;

    if (prefer == XML_CATA_PREFER_NONE)
	return(ret);

    if (xmlDebugCatalogs) {
	switch (prefer) {
	    case XML_CATA_PREFER_PUBLIC:
		xmlCatalogPrintDebug(
			"Setting catalog preference to PUBLIC\n");
		break;
	    case XML_CATA_PREFER_SYSTEM:
		xmlCatalogPrintDebug(
			"Setting catalog preference to SYSTEM\n");
		break;
	    default:
		return(ret);
	}
    }
    xmlCatalogDefaultPrefer = prefer;
    return(ret);
}